

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

Gia_Man_t *
Dam_ManAreaBalanceInt
          (Gia_Man_t *pGia,Vec_Int_t *vCiLevels,int nNewNodesMax,int fVerbose,int fVeryVerbose)

{
  int iDiv;
  int iVar1;
  int v;
  Vec_Que_t *p;
  int *piVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  Dam_Man_t *p_00;
  Vec_Int_t *pVVar6;
  Gia_Man_t *pGVar7;
  abctime aVar8;
  abctime time;
  char *pStr;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  float fVar12;
  
  p_00 = Dam_ManAlloc(pGia);
  pGVar7 = p_00->pGia;
  iVar4 = Gia_ManSetLevels(pGVar7,vCiLevels);
  p_00->nLevelMax = iVar4;
  pVVar6 = Gia_ManReverseLevel(pGVar7);
  p_00->vNodLevR = pVVar6;
  Vec_IntFillExtra(pGVar7->vLevels,(pGVar7->nObjs * 3) / 2,0);
  Dam_ManCreatePairs(p_00,fVerbose);
  iVar4 = 0;
  if (0 < nNewNodesMax) {
    iVar4 = nNewNodesMax;
  }
  while (bVar11 = iVar4 != 0, iVar4 = iVar4 + -1, bVar11) {
    p = p_00->vQue;
    if (p->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0x88,"int Vec_QueSize(Vec_Que_t *)");
    }
    if (p->nSize == 1) break;
    piVar2 = p->pHeap;
    iDiv = piVar2[1];
    if (*p->pCostsFlt == (float *)0x0) {
      fVar12 = (float)iDiv;
    }
    else {
      fVar12 = (*p->pCostsFlt)[iDiv];
    }
    if (fVar12 < 2.0) break;
    piVar3 = p->pOrder;
    piVar3[iDiv] = -1;
    iVar1 = p->nSize;
    p->nSize = iVar1 + -1;
    if (iVar1 + -1 == 1) {
      piVar2[1] = -1;
    }
    else {
      v = piVar2[(long)iVar1 + -1];
      piVar2[(long)iVar1 + -1] = -1;
      piVar2[1] = v;
      piVar3[v] = 1;
      Vec_QueMoveDown(p,v);
    }
    if (fVeryVerbose != 0) {
      Dam_PrintDiv(p_00,iDiv);
    }
    Dam_ManUpdate(p_00,iDiv);
  }
  if (fVeryVerbose != 0) {
    Dam_PrintDiv(p_00,0);
  }
  pGVar7 = Dam_ManMultiAig(p_00);
  if (fVerbose != 0) {
    uVar10 = p_00->vHash->vObjs->nSize / 4 - 1;
    uVar9 = p_00->nDivs;
    printf("Div:  ");
    uVar5 = 1;
    if (1 < (int)uVar10) {
      uVar5 = uVar10;
    }
    printf("  Total =%9d (%6.2f %%) ",((double)(int)uVar10 * 100.0) / (double)(int)uVar5,
           (ulong)uVar10);
    printf("  Used =%9d (%6.2f %%)",((double)(int)uVar9 * 100.0) / (double)(int)uVar5,(ulong)uVar9);
    uVar9 = 1;
    if (1 < p_00->nAnds) {
      uVar9 = p_00->nAnds;
    }
    printf("  Gain =%6d (%6.2f %%)",((double)p_00->nGain * 100.0) / (double)(int)uVar9);
    pStr = (char *)(ulong)(uint)p_00->nGainX;
    printf("  GainX = %d  ");
    aVar8 = Abc_Clock();
    Abc_PrintTime((int)aVar8 - (int)p_00->clkStart,pStr,time);
  }
  Dam_ManFree(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Dam_ManAreaBalanceInt( Gia_Man_t * pGia, Vec_Int_t * vCiLevels, int nNewNodesMax, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew;
    Dam_Man_t * p;
    int i, iDiv;
    p = Dam_ManAlloc( pGia );
    p->nLevelMax = Gia_ManSetLevels( p->pGia, vCiLevels );
    p->vNodLevR = Gia_ManReverseLevel( p->pGia );
    Vec_IntFillExtra( p->pGia->vLevels, 3*Gia_ManObjNum(p->pGia)/2, 0 );
    Dam_ManCreatePairs( p, fVerbose );
    for ( i = 0; i < nNewNodesMax && Vec_QueTopPriority(p->vQue) >= 2; i++ )
    {
        iDiv = Vec_QuePop(p->vQue);
        if ( fVeryVerbose )
            Dam_PrintDiv( p, iDiv );
        Dam_ManUpdate( p, iDiv );
    }
    if ( fVeryVerbose )
        Dam_PrintDiv( p, 0 );
    pNew = Dam_ManMultiAig( p );
    if ( fVerbose )
    {
        int nDivsAll = Hash_IntManEntryNum(p->vHash);
        int nDivsUsed = p->nDivs;
        printf( "Div:  " );
        printf( "  Total =%9d (%6.2f %%) ",   nDivsAll,   100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
        printf( "  Used =%9d (%6.2f %%)",     nDivsUsed,  100.0 * nDivsUsed   / Abc_MaxInt(nDivsAll, 1) );
        printf( "  Gain =%6d (%6.2f %%)",     p->nGain,   100.0 * p->nGain / Abc_MaxInt(p->nAnds, 1) );
        printf( "  GainX = %d  ",             p->nGainX  );
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    Dam_ManFree( p );
    return pNew;
}